

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_handle.cpp
# Opt level: O0

bool __thiscall libtorrent::torrent_handle::need_save_resume_data(torrent_handle *this)

{
  bitfield_flag<unsigned_char,_libtorrent::resume_data_flags_tag,_void> bVar1;
  bool bVar2;
  bitfield_flag<unsigned_char,_libtorrent::pause_flags_tag,_void> all_categories;
  torrent_handle *this_local;
  
  bVar1 = libtorrent::flags::operator|
                    ((bitfield_flag<unsigned_char,_libtorrent::resume_data_flags_tag,_void>)0x8,
                     (bitfield_flag<unsigned_char,_libtorrent::resume_data_flags_tag,_void>)0x10);
  bVar1 = libtorrent::flags::operator|
                    (bVar1,(bitfield_flag<unsigned_char,_libtorrent::resume_data_flags_tag,_void>)
                           0x20);
  bVar1 = libtorrent::flags::operator|
                    (bVar1,(bitfield_flag<unsigned_char,_libtorrent::resume_data_flags_tag,_void>)
                           0x40);
  libtorrent::flags::operator|
            (bVar1,(bitfield_flag<unsigned_char,_libtorrent::resume_data_flags_tag,_void>)0x80);
  bVar2 = sync_call_ret<bool,bool(libtorrent::aux::torrent::*)(libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::resume_data_flags_tag,void>)const,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::resume_data_flags_tag,void>const&>
                    (this,false,0x707200,
                     (bitfield_flag<unsigned_char,_libtorrent::pause_flags_tag,_void> *)0x0);
  return bVar2;
}

Assistant:

bool torrent_handle::need_save_resume_data() const
	{
		auto const all_categories
			= torrent_handle::if_counters_changed
			| torrent_handle::if_download_progress
			| torrent_handle::if_config_changed
			| torrent_handle::if_state_changed
			| torrent_handle::if_metadata_changed
			;
		return sync_call_ret<bool>(false, &aux::torrent::need_save_resume_data, all_categories);
	}